

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O3

void __thiscall
Catch::IStreamingReporter::listTags
          (IStreamingReporter *this,vector<Catch::TagInfo,_std::allocator<Catch::TagInfo>_> *tags,
          IConfig *config)

{
  pointer pTVar1;
  int iVar2;
  Singleton<Catch::StringStreams,_Catch::StringStreams,_Catch::StringStreams> *pSVar3;
  size_t sVar4;
  ostream *poVar5;
  long lVar6;
  pointer this_00;
  char *pcVar7;
  pointer pTVar8;
  string str;
  Column wrapper;
  ReusableStringStream rss;
  long *local_f8;
  long local_f0;
  long local_e8 [2];
  size_t local_d8;
  size_t sStack_d0;
  size_t local_c8;
  char local_c0;
  undefined7 uStack_bf;
  size_t local_b8;
  long local_b0 [2];
  string local_a0;
  vector<Catch::TagInfo,_std::allocator<Catch::TagInfo>_> *local_80;
  undefined1 local_78 [8];
  _Alloc_hider local_70;
  undefined1 local_68 [24];
  size_t sStack_50;
  size_t local_48;
  ReusableStringStream local_40;
  
  iVar2 = (*config->_vptr_IConfig[0xe])(config);
  if ((char)iVar2 == '\0') {
    pcVar7 = "All available tags:\n";
    lVar6 = 0x14;
  }
  else {
    pcVar7 = "Tags for matching test cases:\n";
    lVar6 = 0x1e;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar7,lVar6);
  this_00 = (tags->super__Vector_base<Catch::TagInfo,_std::allocator<Catch::TagInfo>_>)._M_impl.
            super__Vector_impl_data._M_start;
  pTVar1 = (tags->super__Vector_base<Catch::TagInfo,_std::allocator<Catch::TagInfo>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  pTVar8 = this_00;
  if (this_00 != pTVar1) {
    local_80 = tags;
    do {
      pSVar3 = Singleton<Catch::StringStreams,_Catch::StringStreams,_Catch::StringStreams>::
               getInternal();
      sVar4 = StringStreams::add(&pSVar3->super_StringStreams);
      local_40.m_index = sVar4;
      pSVar3 = Singleton<Catch::StringStreams,_Catch::StringStreams,_Catch::StringStreams>::
               getInternal();
      poVar5 = (ostream *)
               (pSVar3->super_StringStreams).m_streams.
               super__Vector_base<Catch::Detail::unique_ptr<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<Catch::Detail::unique_ptr<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[sVar4].m_ptr;
      local_40.m_oss = poVar5;
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"  ",2);
      *(undefined8 *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 0x10) = 2;
      std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"  ",2);
      std::__cxx11::stringbuf::str();
      TagInfo::all_abi_cxx11_(&local_a0,this_00);
      local_f8 = local_e8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_f8,local_a0._M_dataplus._M_p,
                 local_a0._M_dataplus._M_p + local_a0._M_string_length);
      local_c8 = 0;
      sStack_d0 = local_b8;
      local_d8 = 0x46;
      local_78 = (undefined1  [8])local_68;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_78,local_f8,local_f0 + (long)local_f8);
      local_48 = local_c8;
      local_68._16_8_ = local_d8;
      sStack_50 = sStack_d0;
      if (local_f8 != local_e8) {
        operator_delete(local_f8,local_e8[0] + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
        operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
      }
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,(char *)CONCAT71(uStack_bf,local_c0),local_b8);
      TextFlow::operator<<(poVar5,(Column *)local_78);
      local_f8 = (long *)CONCAT71(local_f8._1_7_,10);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,(char *)&local_f8,1);
      if (local_78 != (undefined1  [8])local_68) {
        operator_delete((void *)local_78,local_68._0_8_ + 1);
      }
      if ((long *)CONCAT71(uStack_bf,local_c0) != local_b0) {
        operator_delete((long *)CONCAT71(uStack_bf,local_c0),local_b0[0] + 1);
      }
      ReusableStringStream::~ReusableStringStream(&local_40);
      this_00 = this_00 + 1;
    } while (this_00 != pTVar1);
    this_00 = (local_80->super__Vector_base<Catch::TagInfo,_std::allocator<Catch::TagInfo>_>).
              _M_impl.super__Vector_impl_data._M_finish;
    pTVar8 = (local_80->super__Vector_base<Catch::TagInfo,_std::allocator<Catch::TagInfo>_>)._M_impl
             .super__Vector_impl_data._M_start;
  }
  local_f8 = local_e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"tag","");
  local_78 = (undefined1  [8])(((long)this_00 - (long)pTVar8 >> 3) * 0x6db6db6db6db6db7);
  local_70._M_p = local_68 + 8;
  std::__cxx11::string::_M_construct<char*>((string *)&local_70,local_f8,local_f0 + (long)local_f8);
  operator<<((ostream *)&std::cout,(pluralise *)local_78);
  local_c0 = '\n';
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,&local_c0,1);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
  std::ostream::put((char)poVar5);
  std::ostream::flush();
  if (local_70._M_p != local_68 + 8) {
    operator_delete(local_70._M_p,local_68._8_8_ + 1);
  }
  if (local_f8 != local_e8) {
    operator_delete(local_f8,local_e8[0] + 1);
  }
  return;
}

Assistant:

void IStreamingReporter::listTags(std::vector<TagInfo> const &tags, IConfig const &config) {
        if (config.hasTestFilters()) {
            Catch::cout() << "Tags for matching test cases:\n";
        }
        else {
            Catch::cout() << "All available tags:\n";
        }

        for (auto const &tagCount : tags) {
            ReusableStringStream rss;
            rss << "  " << std::setw(2) << tagCount.count << "  ";
            auto str = rss.str();
            auto wrapper = TextFlow::Column(tagCount.all())
                .initialIndent(0)
                .indent(str.size())
                .width(CATCH_CONFIG_CONSOLE_WIDTH - 10);
            Catch::cout() << str << wrapper << '\n';
        }
        Catch::cout() << pluralise(tags.size(), "tag") << '\n' << std::endl;
    }